

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5IndexExtractCol(u8 **pa,int n,int iCol)

{
  u8 uVar1;
  uint in_EAX;
  uint uVar2;
  u8 *puVar3;
  int iVar4;
  u8 *puVar5;
  int iCurrent;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  puVar5 = *pa;
  puVar3 = puVar5 + n;
  iVar4 = 0;
  if (iCol < 1) {
    uStack_38._4_4_ = 0;
  }
  else {
    do {
      while (*puVar5 != '\x01') {
        do {
          uVar1 = *puVar5;
          puVar5 = puVar5 + 1;
        } while ((char)uVar1 < '\0');
        if (puVar3 <= puVar5) {
          return 0;
        }
      }
      *pa = puVar5;
      uStack_38 = (ulong)CONCAT14(puVar5[1],(undefined4)uStack_38);
      if ((char)puVar5[1] < '\0') {
        uVar2 = sqlite3Fts5GetVarint32(puVar5 + 1,(u32 *)((long)&uStack_38 + 4));
        puVar5 = puVar5 + 1 + uVar2;
      }
      else {
        puVar5 = puVar5 + 2;
      }
    } while (uStack_38._4_4_ < iCol);
  }
  if (uStack_38._4_4_ == iCol) {
    while ((puVar5 < puVar3 && (*puVar5 != '\x01'))) {
      do {
        uVar1 = *puVar5;
        puVar5 = puVar5 + 1;
      } while ((char)uVar1 < '\0');
    }
    iVar4 = (int)puVar5 - *(int *)pa;
  }
  return iVar4;
}

Assistant:

static int fts5IndexExtractCol(
  const u8 **pa,                  /* IN/OUT: Pointer to poslist */
  int n,                          /* IN: Size of poslist in bytes */
  int iCol                        /* Column to extract from poslist */
){
  int iCurrent = 0;               /* Anything before the first 0x01 is col 0 */
  const u8 *p = *pa;
  const u8 *pEnd = &p[n];         /* One byte past end of position list */

  while( iCol>iCurrent ){
    /* Advance pointer p until it points to pEnd or an 0x01 byte that is
    ** not part of a varint. Note that it is not possible for a negative
    ** or extremely large varint to occur within an uncorrupted position 
    ** list. So the last byte of each varint may be assumed to have a clear
    ** 0x80 bit.  */
    while( *p!=0x01 ){
      while( *p++ & 0x80 );
      if( p>=pEnd ) return 0;
    }
    *pa = p++;
    iCurrent = *p++;
    if( iCurrent & 0x80 ){
      p--;
      p += fts5GetVarint32(p, iCurrent);
    }
  }
  if( iCol!=iCurrent ) return 0;

  /* Advance pointer p until it points to pEnd or an 0x01 byte that is
  ** not part of a varint */
  while( p<pEnd && *p!=0x01 ){
    while( *p++ & 0x80 );
  }

  return p - (*pa);
}